

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O1

LY_ERR lyd_create_any(lysc_node *schema,void *value,LYD_ANYDATA_VALUETYPE value_type,
                     ly_bool use_value,lyd_node **node)

{
  ushort uVar1;
  LYD_ANYDATA_VALUETYPE LVar2;
  LY_ERR LVar3;
  lyd_node *trg;
  ly_in *in;
  lyd_node *tree;
  lyd_any_value any_val;
  LYD_ANYDATA_VALUETYPE local_54;
  ly_in *local_50;
  lyd_any_value local_48;
  lyd_node **local_40;
  lyd_any_value local_38;
  
  local_50 = (ly_in *)0x0;
  uVar1 = schema->nodetype;
  local_54 = value_type;
  local_40 = node;
  if ((uVar1 & 0x60) == 0) {
    __assert_fail("schema->nodetype & LYD_NODE_ANY",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_new.c"
                  ,0x140,
                  "LY_ERR lyd_create_any(const struct lysc_node *, const void *, LYD_ANYDATA_VALUETYPE, ly_bool, struct lyd_node **)"
                 );
  }
  trg = (lyd_node *)calloc(1,0x48);
  if (trg == (lyd_node *)0x0) {
    ly_log(schema->module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyd_create_any")
    ;
    return LY_EMEM;
  }
  trg->schema = schema;
  trg->prev = trg;
  trg->flags = 4;
  if (uVar1 == 0x60) {
    if (value_type == LYD_ANYDATA_STRING) {
      lyd_create_any_string_valtype(value,&local_54);
    }
    LVar2 = local_54;
    if (local_54 == LYD_ANYDATA_DATATREE) goto LAB_0012b345;
    if (value == (void *)0x0) {
      __assert_fail("value",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_new.c"
                    ,0x152,
                    "LY_ERR lyd_create_any(const struct lysc_node *, const void *, LYD_ANYDATA_VALUETYPE, ly_bool, struct lyd_node **)"
                   );
    }
    LVar3 = ly_in_new_memory((char *)value,&local_50);
    if (LVar3 != LY_SUCCESS) goto LAB_0012b3ac;
    LVar3 = lyd_create_any_datatree(schema->module->ctx,local_50,LVar2,'\x01',&local_48.tree);
    if (LVar3 != LY_SUCCESS) {
      ly_log(schema->module->ctx,LY_LLERR,LY_SUCCESS,"Failed to parse any content into a data tree."
            );
      goto LAB_0012b3ac;
    }
LAB_0012b328:
    if (use_value != '\0') {
      free(value);
    }
    local_54 = LYD_ANYDATA_DATATREE;
    use_value = '\x01';
    value = (void *)local_48;
  }
  else if (value_type - LYD_ANYDATA_XML < 3) {
    if (value == (void *)0x0) {
      value = (lyd_node *)0x0;
    }
    else {
LAB_0012b2f2:
      LVar3 = ly_in_new_memory((char *)value,&local_50);
      if (LVar3 != LY_SUCCESS) goto LAB_0012b3ac;
      LVar3 = lyd_create_any_datatree(schema->module->ctx,local_50,local_54,'\0',&local_48.tree);
      if (LVar3 == LY_SUCCESS) goto LAB_0012b328;
    }
  }
  else if (((value_type == LYD_ANYDATA_STRING) &&
           (lyd_create_any_string_valtype(value,&local_54), value != (void *)0x0)) &&
          (LYD_ANYDATA_STRING < local_54)) goto LAB_0012b2f2;
LAB_0012b345:
  LVar2 = local_54;
  if (use_value == '\0') {
    local_38 = (lyd_any_value)value;
    LVar3 = lyd_any_copy_value(trg,&local_38,local_54);
    if (LVar3 != LY_SUCCESS) goto LAB_0012b3ac;
  }
  else {
    if (local_54 - LYD_ANYDATA_STRING < 3) {
      LVar3 = lydict_insert_zc(schema->module->ctx,(char *)value,(char **)(trg + 1));
      if (LVar3 != LY_SUCCESS) goto LAB_0012b3ac;
    }
    else if ((local_54 == LYD_ANYDATA_DATATREE) || (local_54 == LYD_ANYDATA_LYB)) {
      ((lyd_any_value *)(trg + 1))->str = (char *)value;
    }
    *(LYD_ANYDATA_VALUETYPE *)&trg[1].schema = LVar2;
  }
  lyd_hash(trg);
  LVar3 = LY_SUCCESS;
LAB_0012b3ac:
  if (LVar3 == LY_SUCCESS) {
    *local_40 = trg;
  }
  else {
    lyd_free_tree(trg);
  }
  ly_in_free(local_50,'\0');
  return LVar3;
}

Assistant:

LY_ERR
lyd_create_any(const struct lysc_node *schema, const void *value, LYD_ANYDATA_VALUETYPE value_type, ly_bool use_value,
        struct lyd_node **node)
{
    LY_ERR rc = LY_SUCCESS, r;
    struct lyd_node *tree;
    struct lyd_node_any *any = NULL;
    union lyd_any_value any_val;
    struct ly_in *in = NULL;

    assert(schema->nodetype & LYD_NODE_ANY);

    any = calloc(1, sizeof *any);
    LY_CHECK_ERR_RET(!any, LOGMEM(schema->module->ctx), LY_EMEM);

    any->schema = schema;
    any->prev = &any->node;
    any->flags = LYD_NEW;

    if (schema->nodetype == LYS_ANYDATA) {
        /* anydata */
        if (value_type == LYD_ANYDATA_STRING) {
            /* detect value type */
            lyd_create_any_string_valtype(value, &value_type);
        }

        if (value_type != LYD_ANYDATA_DATATREE) {
            /* create input */
            assert(value);
            LY_CHECK_GOTO(rc = ly_in_new_memory(value, &in), cleanup);

            /* parse as a data tree */
            if ((r = lyd_create_any_datatree(schema->module->ctx, in, value_type, 1, &tree))) {
                LOGERR(schema->module->ctx, rc, "Failed to parse any content into a data tree.");
                rc = r;
                goto cleanup;
            }

            /* use the parsed data tree */
            if (use_value) {
                free((void *)value);
            }
            use_value = 1;
            value = tree;
            value_type = LYD_ANYDATA_DATATREE;
        }
    } else {
        /* anyxml */
        switch (value_type) {
        case LYD_ANYDATA_DATATREE:
            /* fine, just use the value */
            break;
        case LYD_ANYDATA_STRING:
            /* detect value type */
            lyd_create_any_string_valtype(value, &value_type);
            if ((value_type == LYD_ANYDATA_DATATREE) || (value_type == LYD_ANYDATA_STRING)) {
                break;
            }
        /* fallthrough */
        case LYD_ANYDATA_XML:
        case LYD_ANYDATA_JSON:
        case LYD_ANYDATA_LYB:
            if (!value) {
                /* nothing to parse */
                break;
            }

            /* create input */
            LY_CHECK_GOTO(rc = ly_in_new_memory(value, &in), cleanup);

            /* try to parse as a data tree */
            r = lyd_create_any_datatree(schema->module->ctx, in, value_type, 0, &tree);
            if (!r) {
                /* use the parsed data tree */
                if (use_value) {
                    free((void *)value);
                }
                use_value = 1;
                value = tree;
                value_type = LYD_ANYDATA_DATATREE;
            }
            break;
        }
    }

    if (use_value) {
        switch (value_type) {
        case LYD_ANYDATA_DATATREE:
            any->value.tree = (void *)value;
            break;
        case LYD_ANYDATA_STRING:
        case LYD_ANYDATA_XML:
        case LYD_ANYDATA_JSON:
            LY_CHECK_GOTO(rc = lydict_insert_zc(schema->module->ctx, (void *)value, &any->value.str), cleanup);
            break;
        case LYD_ANYDATA_LYB:
            any->value.mem = (void *)value;
            break;
        }
        any->value_type = value_type;
    } else {
        any_val.str = value;
        LY_CHECK_GOTO(rc = lyd_any_copy_value(&any->node, &any_val, value_type), cleanup);
    }
    lyd_hash(&any->node);

cleanup:
    if (rc) {
        lyd_free_tree(&any->node);
    } else {
        *node = &any->node;
    }
    ly_in_free(in, 0);
    return rc;
}